

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.cpp
# Opt level: O2

IDeckLinkScreenPreviewCallback *
cdecklink_internal_callback_create_deck_link_screen_preview_callback
          (void *ctx,cdecklink_screen_preview_callback_draw_frame *cb0)

{
  IDeckLinkScreenPreviewCallback *pIVar1;
  
  if (cb0 != (cdecklink_screen_preview_callback_draw_frame *)0x0) {
    pIVar1 = (IDeckLinkScreenPreviewCallback *)operator_new(0x20);
    (pIVar1->super_IUnknown)._vptr_IUnknown = (_func_int **)&PTR_QueryInterface_00108c88;
    *(undefined4 *)&pIVar1[1].super_IUnknown._vptr_IUnknown = 0;
    pIVar1[2].super_IUnknown._vptr_IUnknown = (_func_int **)ctx;
    pIVar1[3].super_IUnknown._vptr_IUnknown = (_func_int **)cb0;
    return pIVar1;
  }
  return (IDeckLinkScreenPreviewCallback *)0x0;
}

Assistant:

IDeckLinkScreenPreviewCallback* cdecklink_internal_callback_create_deck_link_screen_preview_callback (void *ctx, cdecklink_screen_preview_callback_draw_frame *cb0) {
	if (cb0 != nullptr) {
		return new DeckLinkScreenPreviewCallback(ctx, cb0);
	}
	return nullptr;
}